

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.H
# Opt level: O2

void __thiscall Fl_Double_Window::flush(Fl_Double_Window *this,int eraseoverlay)

{
  VisualID *pVVar1;
  Fl_X *pFVar2;
  Fl_X *pFVar3;
  int iVar4;
  uint *puVar5;
  Window WVar6;
  ulong uVar7;
  ulong uVar8;
  int H;
  int W;
  int Y;
  int X;
  undefined1 local_28;
  
  if ((this->super_Fl_Window).i == (Fl_X *)0x0) {
    return;
  }
  Fl_Window::make_current(&this->super_Fl_Window);
  pFVar2 = (this->super_Fl_Window).i;
  if (pFVar2 == (Fl_X *)0x0) {
    return;
  }
  if (pFVar2->other_xid == 0) {
    if (can_xdbe()::tried == '\0') {
      can_xdbe()::tried = '\x01';
      iVar4 = XdbeQueryExtension(fl_display,&Y,&W);
      if (iVar4 != 0) {
        _X = *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
        H = 1;
        puVar5 = (uint *)XdbeGetVisualInfo();
        if (puVar5 != (uint *)0x0) {
          uVar7 = (ulong)*puVar5;
          if ((int)*puVar5 < 1) {
            uVar7 = 0;
          }
          uVar8 = 0;
          do {
            if (uVar7 * 0x10 + 0x10 == uVar8 + 0x10) goto LAB_001ab806;
            pVVar1 = (VisualID *)(*(long *)(puVar5 + 2) + uVar8);
            uVar8 = uVar8 + 0x10;
          } while (*pVVar1 != fl_visual->visualid);
          use_xdbe = '\x01';
LAB_001ab806:
          XdbeFreeVisualInfo(puVar5);
          goto LAB_001ab80e;
        }
      }
LAB_001ab832:
      WVar6 = XCreatePixmap(fl_display,
                            *(undefined8 *)
                             (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                            (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
                            (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_,
                            fl_visual->depth);
      pFVar2->other_xid = WVar6;
    }
    else {
LAB_001ab80e:
      if (use_xdbe != '\x01') goto LAB_001ab832;
      pFVar3 = (this->super_Fl_Window).i;
      if (pFVar3 == (Fl_X *)0x0) {
        WVar6 = 0;
      }
      else {
        WVar6 = pFVar3->xid;
      }
      WVar6 = XdbeAllocateBackBufferName(fl_display,WVar6,3);
      pFVar2->other_xid = WVar6;
      pFVar2->backbuffer_bad = '\x01';
    }
    (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ = 0x80;
  }
  if (use_xdbe != '\x01') {
    if (((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ & 0xfd) != 0) {
      fl_clip_region(pFVar2->region);
      pFVar2->region = (Fl_Region)0x0;
      fl_window = pFVar2->other_xid;
      (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[2])();
      fl_window = pFVar2->xid;
    }
    if (eraseoverlay != 0) {
      fl_clip_region((Fl_Region)0x0);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
              (fl_graphics_driver,0,0,
               (ulong)(uint)(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
               (ulong)(uint)(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_,&X,&Y,&W,&H);
    if (pFVar2->other_xid == 0) {
      return;
    }
    fl_copy_offscreen(X,Y,W,H,pFVar2->other_xid,X,Y);
    return;
  }
  if ((eraseoverlay == 0) && (pFVar2->backbuffer_bad == '\0')) {
    if ((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ == '\0') goto LAB_001ab9a7;
  }
  else {
    if (pFVar2->region != (Fl_Region)0x0) {
      XDestroyRegion();
      pFVar2->region = (Fl_Region)0x0;
    }
    (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ = 0x80;
    pFVar2->backbuffer_bad = '\0';
  }
  fl_clip_region(pFVar2->region);
  pFVar2->region = (Fl_Region)0x0;
  fl_window = pFVar2->other_xid;
  (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[2])(this);
  fl_window = pFVar2->xid;
LAB_001ab9a7:
  pFVar2 = (this->super_Fl_Window).i;
  if (pFVar2 == (Fl_X *)0x0) {
    _X = 0;
  }
  else {
    _X = pFVar2->xid;
  }
  local_28 = 3;
  XdbeSwapBuffers(fl_display,&X,1);
  return;
}

Assistant:

int shown() {return i != 0;}